

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::throwMessage(Forth *this,string *msg,errorCodes ec)

{
  Cell src;
  Cell CVar1;
  string buffer;
  string local_38;
  
  initClass(this);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  src = getSourceAddress(this);
  CVar1 = getSourceBufferSize(this);
  moveFromDataSpace(this,&local_38,src,(ulong)CVar1);
  ForthStack<unsigned_int>::push(&this->dStack,ec);
  exceptionsThrow(this);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void throwMessage(const std::string &msg, enum errorCodes ec){
			initClass();
			std::string buffer{};
			int ecInt=static_cast<int>(ec);
			moveFromDataSpace(buffer, getSourceAddress(), getSourceBufferSize());
			dStack.push(ec);
			exceptionsThrow();
			//throw AbortException(msg + "\nError code " + std::to_string(ecInt) +"\n" + buffer + "\n Offset " + std::to_string(getSourceBufferOffset()));
		}